

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtldurl.cpp
# Opt level: O2

bool __thiscall QPublicSuffixDatabase::loadFile(QPublicSuffixDatabase *this,QString *fileName)

{
  QFile *pQVar1;
  qsizetype qVar2;
  char *pcVar3;
  Data *pDVar4;
  undefined8 uVar5;
  char cVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  storage_type *psVar10;
  undefined8 *puVar11;
  long in_FS_OFFSET;
  char version;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_70 [16];
  undefined8 *puStack_60;
  undefined1 *local_58;
  QArrayDataPointer<char> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lcTld();
  if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_48.d._0_4_ = 2;
    local_48.d._4_4_ = 0;
    local_48.ptr._0_4_ = 0;
    local_48.ptr._4_4_ = 0;
    local_48.size._0_4_ = 0;
    local_48.size._4_4_ = 0;
    local_30 = lcTld::category.name;
    QString::toUtf8_helper((QString *)(local_70 + 8));
    puVar11 = puStack_60;
    if (puStack_60 == (undefined8 *)0x0) {
      puVar11 = &QByteArray::_empty;
    }
    QMessageLogger::debug((char *)&local_48,"Loading publicsuffix file: %s",puVar11);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_70 + 8));
  }
  local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::make_unique<QFile,QString_const&>((QString *)local_70);
  cVar6 = (**(code **)(*(long *)local_70._0_8_ + 0x68))(local_70._0_8_,1);
  if (cVar6 == '\0') {
    lcTld();
    if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_48.d._0_4_ = 2;
      local_48.size._4_4_ = 0;
      local_48.d._4_4_ = 0;
      local_48.ptr._0_4_ = 0;
      local_48.ptr._4_4_ = 0;
      local_48.size._0_4_ = 0;
      local_30 = lcTld::category.name;
      QIODevice::errorString();
      QString::toUtf8_helper((QString *)(local_70 + 8));
      puVar11 = puStack_60;
      if (puStack_60 == (undefined8 *)0x0) {
        puVar11 = &QByteArray::_empty;
      }
      bVar7 = false;
      QMessageLogger::debug((char *)&local_48,"Failed to open publicsuffix file: %s",puVar11);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_70 + 8));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      goto LAB_0020d14a;
    }
  }
  else {
    lVar8 = (**(code **)(*(long *)local_70._0_8_ + 0x80))();
    if (0x11 < lVar8) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
      QIODevice::read((longlong)(local_70 + 8));
      local_48.d._0_4_ = SUB84(local_58,0);
      local_48.d._4_4_ = (undefined4)((ulong)local_58 >> 0x20);
      local_48.ptr._0_4_ = SUB84(puStack_60,0);
      local_48.ptr._4_4_ = (undefined4)((ulong)puStack_60 >> 0x20);
      bVar7 = operator!=((QByteArrayView *)&local_48,&loadFile::DafsaFileHeader);
      if (bVar7) {
        lcTld();
        if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0) {
LAB_0020d13e:
          bVar7 = false;
        }
        else {
          local_48.d._0_4_ = 2;
          local_48.d._4_4_ = 0;
          local_48.ptr._0_4_ = 0;
          local_48.ptr._4_4_ = 0;
          local_48.size._0_4_ = 0;
          local_48.size._4_4_ = 0;
          local_30 = lcTld::category.name;
          bVar7 = false;
          QByteArray::toHex((char)&local_88);
          if (local_88.ptr == (char16_t *)0x0) {
            local_88.ptr = (char16_t *)&QByteArray::_empty;
          }
          QMessageLogger::warning
                    ((char *)&local_48,"Invalid publicsuffix file header: %s",local_88.ptr);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
        }
      }
      else {
        cVar6 = (**(code **)(*(long *)local_70._0_8_ + 0x88))(local_70._0_8_,lVar8 + -1);
        if (cVar6 == '\0') {
          lcTld();
          if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
          goto LAB_0020d13e;
          local_48.d._0_4_ = 2;
          local_48.size._4_4_ = 0;
          local_48.d._4_4_ = 0;
          local_48.ptr._0_4_ = 0;
          local_48.ptr._4_4_ = 0;
          local_48.size._0_4_ = 0;
          local_30 = lcTld::category.name;
          QIODevice::errorString();
          QString::toUtf8_helper((QString *)&local_88);
          if (local_88.ptr == (char16_t *)0x0) {
            local_88.ptr = (char16_t *)&QByteArray::_empty;
          }
          bVar7 = false;
          QMessageLogger::warning
                    ((char *)&local_48,"Failed to seek to the end of file: %s",local_88.ptr);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        }
        else {
          version = -0x56;
          lVar9 = QIODevice::read((char *)local_70._0_8_,(longlong)&version);
          if (lVar9 == 1) {
            if (version == '\x01') {
              lVar8 = lVar8 + -0x11;
              psVar10 = (storage_type *)QFileDevice::map(local_70._0_8_,0x10,lVar8,0);
              lcTld();
              if (psVar10 == (storage_type *)0x0) {
                if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
                    0) {
                  local_48.d._0_4_ = 2;
                  local_48.size._4_4_ = 0;
                  local_48.d._4_4_ = 0;
                  local_48.ptr._0_4_ = 0;
                  local_48.ptr._4_4_ = 0;
                  local_48.size._0_4_ = 0;
                  local_30 = lcTld::category.name;
                  QIODevice::errorString();
                  QString::toUtf8_helper((QString *)&local_88);
                  if (local_88.ptr == (char16_t *)0x0) {
                    local_88.ptr = (char16_t *)&QByteArray::_empty;
                  }
                  QMessageLogger::debug
                            ((char *)&local_48,"Failed to map publicsuffix file: %s",local_88.ptr);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
                }
                (**(code **)(*(long *)local_70._0_8_ + 0x88))(local_70._0_8_,0x10);
                QIODevice::read((longlong)&local_48);
                pDVar4 = (this->m_storage).d.d;
                pcVar3 = (this->m_storage).d.ptr;
                (this->m_storage).d.d = (Data *)CONCAT44(local_48.d._4_4_,local_48.d._0_4_);
                (this->m_storage).d.ptr = (char *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
                local_48.d._0_4_ = SUB84(pDVar4,0);
                local_48.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
                local_48.ptr._0_4_ = SUB84(pcVar3,0);
                local_48.ptr._4_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
                qVar2 = (this->m_storage).d.size;
                (this->m_storage).d.size = CONCAT44(local_48.size._4_4_,(undefined4)local_48.size);
                local_48.size._0_4_ = (undefined4)qVar2;
                local_48.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
                QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
                lVar9 = (this->m_storage).d.size;
                lcTld();
                if (lVar9 != lVar8) {
                  if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
                      != 0) {
                    local_48.d._0_4_ = 2;
                    local_48.d._4_4_ = 0;
                    local_48.ptr._0_4_ = 0;
                    local_48.ptr._4_4_ = 0;
                    local_48.size._0_4_ = 0;
                    local_48.size._4_4_ = 0;
                    local_30 = lcTld::category.name;
                    QMessageLogger::warning((char *)&local_48,"Failed to read publicsuffix file");
                  }
                  QByteArray::clear();
                  goto LAB_0020d13e;
                }
                if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
                    0) {
                  local_48.d._0_4_ = 2;
                  local_48.d._4_4_ = 0;
                  local_48.ptr._0_4_ = 0;
                  local_48.ptr._4_4_ = 0;
                  local_48.size._0_4_ = 0;
                  local_48.size._4_4_ = 0;
                  local_30 = lcTld::category.name;
                  QMessageLogger::debug((char *)&local_48,"Using system publicsuffix data");
                }
                pcVar3 = (this->m_storage).d.ptr;
                (this->m_data).m_size = (this->m_storage).d.size;
                (this->m_data).m_data = pcVar3;
                bVar7 = true;
              }
              else {
                if (((byte)lcTld::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
                    0) {
                  local_48.d._0_4_ = 2;
                  local_48.d._4_4_ = 0;
                  local_48.ptr._0_4_ = 0;
                  local_48.ptr._4_4_ = 0;
                  local_48.size._0_4_ = 0;
                  local_48.size._4_4_ = 0;
                  local_30 = lcTld::category.name;
                  QMessageLogger::debug((char *)&local_48,"Using mapped system publicsuffix data");
                }
                (**(code **)(*(long *)local_70._0_8_ + 0x70))();
                uVar5 = local_70._0_8_;
                (this->m_data).m_size = lVar8;
                (this->m_data).m_data = psVar10;
                local_70._0_8_ = (QFile *)0x0;
                pQVar1 = (this->m_dev)._M_t.
                         super___uniq_ptr_impl<QFile,_std::default_delete<QFile>_>._M_t.
                         super__Tuple_impl<0UL,_QFile_*,_std::default_delete<QFile>_>.
                         super__Head_base<0UL,_QFile_*,_false>._M_head_impl;
                (this->m_dev)._M_t.super___uniq_ptr_impl<QFile,_std::default_delete<QFile>_>._M_t.
                super__Tuple_impl<0UL,_QFile_*,_std::default_delete<QFile>_>.
                super__Head_base<0UL,_QFile_*,_false>._M_head_impl = (QFile *)uVar5;
                bVar7 = true;
                if (pQVar1 != (QFile *)0x0) {
                  (**(code **)(*(long *)pQVar1 + 0x20))();
                }
              }
            }
            else {
              lcTld();
              if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) ==
                  0) goto LAB_0020d13e;
              local_48.d._0_4_ = 2;
              local_48.size._4_4_ = 0;
              local_48.d._4_4_ = 0;
              local_48.ptr._0_4_ = 0;
              local_48.ptr._4_4_ = 0;
              local_48.size._0_4_ = 0;
              local_30 = lcTld::category.name;
              bVar7 = false;
              QMessageLogger::warning
                        ((char *)&local_48,"Unsupported publicsuffix version: %d",
                         (ulong)(uint)(int)version);
            }
          }
          else {
            lcTld();
            if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
            goto LAB_0020d13e;
            local_48.d._0_4_ = 2;
            local_48.d._4_4_ = 0;
            local_48.ptr._0_4_ = 0;
            local_48.ptr._4_4_ = 0;
            local_48.size._0_4_ = 0;
            local_48.size._4_4_ = 0;
            local_30 = lcTld::category.name;
            bVar7 = false;
            QMessageLogger::warning((char *)&local_48,"Failed to read publicsuffix version");
          }
        }
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_70 + 8));
      goto LAB_0020d14a;
    }
    lcTld();
    if (((byte)lcTld::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_48.d._0_4_ = 2;
      local_48.d._4_4_ = 0;
      local_48.ptr._0_4_ = 0;
      local_48.ptr._4_4_ = 0;
      local_48.size._0_4_ = 0;
      local_48.size._4_4_ = 0;
      local_30 = lcTld::category.name;
      bVar7 = false;
      QMessageLogger::warning((char *)&local_48,"publicsuffix file is too small: %zu",lVar8);
      goto LAB_0020d14a;
    }
  }
  bVar7 = false;
LAB_0020d14a:
  if ((QFile *)local_70._0_8_ != (QFile *)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QPublicSuffixDatabase::loadFile(const QString &fileName)
{
    static const QByteArrayView DafsaFileHeader = ".DAFSA@PSL_0   \n";

    qCDebug(lcTld, "Loading publicsuffix file: %s", qUtf8Printable(fileName));

    auto systemFile = std::make_unique<QFile>(fileName);

    if (!systemFile->open(QIODevice::ReadOnly)) {
        qCDebug(lcTld, "Failed to open publicsuffix file: %s",
                qUtf8Printable(systemFile->errorString()));
        return false;
    }

    auto fileSize = systemFile->size();
    // Check if there is enough data for header, version byte and some data
    if (fileSize < DafsaFileHeader.size() + 2) {
        qCWarning(lcTld, "publicsuffix file is too small: %zu", std::size_t(fileSize));
        return false;
    }

    auto header = systemFile->read(DafsaFileHeader.size());
    if (header != DafsaFileHeader) {
        qCWarning(lcTld, "Invalid publicsuffix file header: %s", header.toHex().constData());
        return false;
    }

    // Check if the file is UTF-8 compatible
    if (!systemFile->seek(fileSize - 1)) {
        qCWarning(lcTld, "Failed to seek to the end of file: %s",
                  qUtf8Printable(systemFile->errorString()));
        return false;
    }

    char version;
    if (systemFile->read(&version, 1) != 1) {
        qCWarning(lcTld, "Failed to read publicsuffix version");
        return false;
    }

    if (version != 0x01) {
        qCWarning(lcTld, "Unsupported publicsuffix version: %d", int(version));
        return false;
    }

    const auto dataSize = fileSize - DafsaFileHeader.size() - 1;
    // Try to map the file first
    auto mappedData = systemFile->map(DafsaFileHeader.size(), dataSize);
    if (mappedData) {
        qCDebug(lcTld, "Using mapped system publicsuffix data");
        systemFile->close();
        m_data = QByteArrayView(mappedData, dataSize);
        m_dev = std::move(systemFile);
        return true;
    }

    qCDebug(lcTld, "Failed to map publicsuffix file: %s",
            qUtf8Printable(systemFile->errorString()));

    systemFile->seek(DafsaFileHeader.size());
    m_storage = systemFile->read(dataSize);
    if (m_storage.size() != dataSize) {
        qCWarning(lcTld, "Failed to read publicsuffix file");
        m_storage.clear();
        return false;
    }

    qCDebug(lcTld, "Using system publicsuffix data");
    m_data = m_storage;

    return true;
}